

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  pointer *this;
  char cVar1;
  ostream *poVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  long *local_128 [2];
  long local_118 [2];
  double local_108;
  undefined1 local_100 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string line;
  string s1;
  double local_a0;
  undefined1 local_78 [8];
  string s2;
  string name;
  int count;
  
  line.field_2._8_8_ = &s1._M_string_length;
  s1._M_dataplus._M_p = (pointer)0x0;
  s1._M_string_length._0_1_ = 0;
  local_78 = (undefined1  [8])&s2._M_string_length;
  s2._M_dataplus._M_p = (pointer)0x0;
  s2._M_string_length._0_1_ = 0;
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x38);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)(line.field_2._M_local_buf + 8),cVar1);
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x38);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)local_78,cVar1);
  std::istream::operator>>((istream *)&std::cin,(int *)(name.field_2._M_local_buf + 0xc));
  std::istream::ignore();
  dVar10 = get_number((string *)((long)&line.field_2 + 8));
  dVar11 = get_number((string *)local_78);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)line.field_2._8_8_,(long)s1._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  dVar10 = (dVar10 * 3.141592653589793) / 180.0;
  poVar2 = std::ostream::_M_insert<double>(dVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_78,(long)s2._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  dVar11 = (dVar11 * 3.141592653589793) / 180.0;
  poVar2 = std::ostream::_M_insert<double>(dVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  plVar3 = (long *)std::ostream::operator<<(poVar2,name.field_2._12_4_);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  s2.field_2._8_8_ = &name._M_string_length;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length._0_1_ = 0;
  if (0 < (int)name.field_2._12_4_) {
    iVar7 = 0;
    this = &parts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar6 = 0;
    do {
      parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&line._M_string_length;
      line._M_dataplus._M_p = (pointer)0x0;
      line._M_string_length._0_1_ = 0;
      cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x38);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)this,cVar1);
      s1.field_2._12_4_ = iVar6;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_100,6,(allocator_type *)local_128);
      bVar9 = false;
      lVar4 = std::__cxx11::string::find((char)this,0x3b);
      if (lVar4 == -1) {
        iVar7 = -1;
      }
      else {
        uVar8 = 0xffffffffffffffff;
        lVar4 = 0;
        do {
          std::__cxx11::string::substr((ulong)local_128,(ulong)this);
          std::__cxx11::string::operator=
                    ((string *)((long)&((_Alloc_hider *)local_100)->_M_p + lVar4),
                     (string *)local_128);
          if (local_128[0] != local_118) {
            operator_delete(local_128[0],local_118[0] + 1);
          }
          std::__cxx11::string::substr((ulong)local_128,(ulong)this);
          std::__cxx11::string::operator=((string *)this,(string *)local_128);
          if (local_128[0] != local_118) {
            operator_delete(local_128[0],local_118[0] + 1);
          }
          if (uVar8 == 3) {
            std::__cxx11::string::_M_assign((string *)((long)local_100 + 0xa0));
            dVar12 = get_number((string *)((long)local_100 + 0x80));
            dVar13 = get_number((string *)((long)local_100 + 0xa0));
            local_108 = (dVar13 * 3.141592653589793) / 180.0;
            dVar13 = cos((dVar10 + local_108) * 0.5);
            dVar13 = dVar13 * ((dVar12 * 3.141592653589793) / 180.0 - dVar10);
            dVar12 = local_108 - dVar11;
            dVar12 = SQRT(dVar13 * dVar13 + dVar12 * dVar12) * 6371.0;
            bVar9 = true;
            if ((name._M_dataplus._M_p == (pointer)0x0) || (dVar12 < local_a0)) {
              std::__cxx11::string::_M_assign((string *)(s2.field_2._M_local_buf + 8));
              local_a0 = dVar12;
            }
            goto LAB_0010279f;
          }
          lVar5 = std::__cxx11::string::find((char)this,0x3b);
          uVar8 = uVar8 + 1;
          lVar4 = lVar4 + 0x20;
        } while (lVar5 != -1);
        bVar9 = 3 < uVar8;
        iVar7 = -1;
      }
LAB_0010279f:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_100);
      if (parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&line._M_string_length) {
        operator_delete(parts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        CONCAT71(line._M_string_length._1_7_,(undefined1)line._M_string_length) + 1)
        ;
      }
      if (!bVar9) goto LAB_0010285e;
      iVar6 = s1.field_2._12_4_ + 1;
    } while (iVar6 < (int)name.field_2._12_4_);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)s2.field_2._8_8_,(long)name._M_dataplus._M_p);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  iVar7 = 0;
  std::ostream::flush();
LAB_0010285e:
  if ((size_type *)s2.field_2._8_8_ != &name._M_string_length) {
    operator_delete((void *)s2.field_2._8_8_,
                    CONCAT71(name._M_string_length._1_7_,(undefined1)name._M_string_length) + 1);
  }
  if (local_78 != (undefined1  [8])&s2._M_string_length) {
    operator_delete((void *)local_78,
                    CONCAT71(s2._M_string_length._1_7_,(undefined1)s2._M_string_length) + 1);
  }
  if ((size_type *)line.field_2._8_8_ != &s1._M_string_length) {
    operator_delete((void *)line.field_2._8_8_,
                    CONCAT71(s1._M_string_length._1_7_,(undefined1)s1._M_string_length) + 1);
  }
  return iVar7;
}

Assistant:

int main()
{
        int count;
        std::string s1, s2;
        double longtitude, latitude;
        getline(cin, s1);
        getline(cin, s2);
        cin >> count;
        cin.ignore();

        longtitude = get_number(s1)*M_PI/180;
        latitude = get_number(s2)*M_PI/180;
        std::cerr << s1 << ": " << longtitude << ", " << s2 << ": " << latitude << ", " << count << std::endl;

        std::string name;
        double min_distance;
        for (int i = 0; i < count; i++)
        {
                std::string line;
                getline(cin, line);

                std::vector<std::string> parts(6);
                for (int i = 0; i < 6 - 1; i++)
                {
                    std::string::size_type pos = line.find(';');
                    if (pos == std::string::npos)
                    {
                        //std::cout << "Invalid format: " << line << std::endl;
                        return -1;
                    }
                    parts[i] = line.substr(0, pos);
                    line = line.substr(pos + 1);
                    //std::cerr << "Part #" << i << ": " << parts[i] << std::endl;
                }
                parts[5] = line;
                //std::cerr << "Part #5: " << parts[5] << std::endl;

                double _long = get_number(parts[4])*M_PI/180;
                double _lat = get_number(parts[5])*M_PI/180;
                double x = (_long - longtitude)*cos((_lat + longtitude)/2);
                double y = _lat - latitude;
                double distance = sqrt(x*x + y*y)*6371;

                if (name.empty()
                    || min_distance > distance)
                {
                    name = parts[1];
                    min_distance = distance;
                }
        }

        std::cout << name << std::endl;

        return 0;
}